

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O0

void __thiscall MILBlob::Blob::StorageReader::StorageReader(StorageReader *this,string *filename)

{
  string *filename_local;
  StorageReader *this_local;
  
  std::make_unique<MILBlob::Blob::StorageReader::Impl,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return;
}

Assistant:

StorageReader::StorageReader(std::string filename) : m_impl(std::make_unique<Impl>(std::move(filename))) {}